

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

QCGroup * __thiscall
obx::anon_unknown_3::QCGroup::copyThisAndPush
          (QCGroup *__return_storage_ptr__,QCGroup *this,QueryCondition *other)

{
  unique_ptr<obx::(anonymous_namespace)::QueryCondition,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>_>
  local_40;
  shared_ptr<obx::(anonymous_namespace)::QueryCondition> local_38;
  undefined1 local_21;
  QueryCondition *local_20;
  QueryCondition *other_local;
  QCGroup *this_local;
  QCGroup *copy;
  
  local_21 = 0;
  local_20 = other;
  other_local = &this->super_QueryCondition;
  this_local = __return_storage_ptr__;
  QCGroup(__return_storage_ptr__,this);
  internalCopyAsPtr((anon_unknown_3 *)&local_40,local_20);
  std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>::
  shared_ptr<obx::(anonymous_namespace)::QueryCondition,std::default_delete<obx::(anonymous_namespace)::QueryCondition>,void>
            (&local_38,&local_40);
  std::
  vector<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>,_std::allocator<std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>_>_>
  ::push_back(&__return_storage_ptr__->conditions_,&local_38);
  std::shared_ptr<obx::(anonymous_namespace)::QueryCondition>::~shared_ptr(&local_38);
  std::
  unique_ptr<obx::(anonymous_namespace)::QueryCondition,_std::default_delete<obx::(anonymous_namespace)::QueryCondition>_>
  ::~unique_ptr(&local_40);
  return __return_storage_ptr__;
}

Assistant:

QCGroup copyThisAndPush(const QueryCondition& other) {
        QCGroup copy(*this);
        copy.conditions_.push_back(internalCopyAsPtr(other));
        return copy;
    }